

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

Vec2 __thiscall nite::Vec2::operator+(Vec2 *this,float c)

{
  Vec2 VVar1;
  Vec2 *in_RSI;
  float fVar2;
  float c_local;
  Vec2 *this_local;
  Vec2 *R;
  
  Vec2(this,in_RSI);
  this->x = c + this->x;
  fVar2 = c + this->y;
  this->y = fVar2;
  VVar1.y = 0.0;
  VVar1.x = fVar2;
  return VVar1;
}

Assistant:

nite::Vec2 nite::Vec2::operator+(float c){
	Vec2 R = *this;
	R.x += c;
	R.y += c;
	return R;
}